

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

void __thiscall CS248::Matrix4x4::operator/=(Matrix4x4 *this,double x)

{
  double *pdVar1;
  double in_XMM0_Qa;
  int j;
  int i;
  double rx;
  Matrix4x4 *A;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Matrix4x4 *pMVar2;
  undefined4 local_28;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      pMVar2 = (Matrix4x4 *)(1.0 / in_XMM0_Qa);
      pdVar1 = operator()((Matrix4x4 *)(1.0 / in_XMM0_Qa),in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc8);
      *pdVar1 = (double)pMVar2 * *pdVar1;
    }
  }
  return;
}

Assistant:

void Matrix4x4::operator/=( double x ) {
    Matrix4x4& A( *this );
    double rx = 1./x;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       A( i, j ) *= rx;
    }
  }